

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O0

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::diagnose
          (DiagnosticsReporter *this,DiagnosticDescriptor *desc,SyntaxToken *tk)

{
  SyntaxTree *this_00;
  SyntaxToken local_c8;
  DiagnosticDescriptor local_88;
  SyntaxToken *local_20;
  SyntaxToken *tk_local;
  DiagnosticDescriptor *desc_local;
  DiagnosticsReporter *this_local;
  
  this_00 = (this->tyChecker_->super_SyntaxVisitor).tree_;
  local_20 = tk;
  tk_local = (SyntaxToken *)desc;
  desc_local = (DiagnosticDescriptor *)this;
  DiagnosticDescriptor::DiagnosticDescriptor(&local_88,desc);
  local_c8.field_10 = tk->field_10;
  local_c8.tree_ = tk->tree_;
  local_c8.syntaxK_ = tk->syntaxK_;
  local_c8.byteSize_ = tk->byteSize_;
  local_c8.charSize_ = tk->charSize_;
  local_c8._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_c8.byteOffset_ = tk->byteOffset_;
  local_c8.charOffset_ = tk->charOffset_;
  local_c8.matchingBracket_ = tk->matchingBracket_;
  local_c8.field_7 = tk->field_7;
  local_c8._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_c8.lineno_ = tk->lineno_;
  local_c8.column_ = tk->column_;
  local_c8._44_4_ = *(undefined4 *)&tk->field_0x2c;
  SyntaxTree::newDiagnostic(this_00,&local_88,&local_c8);
  SyntaxToken::~SyntaxToken(&local_c8);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_88);
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::diagnose(DiagnosticDescriptor&& desc, SyntaxToken tk)
{
    tyChecker_->tree_->newDiagnostic(desc, tk);
}